

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::RboStateQueryTests::init(RboStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  RboStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::RboSizeCase::RboSizeCase
            ((RboSizeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_size",
             "RENDERBUFFER_WIDTH and RENDERBUFFER_HEIGHT");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::RboInternalFormatCase::RboInternalFormatCase
            ((RboInternalFormatCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "renderbuffer_internal_format","RENDERBUFFER_INTERNAL_FORMAT");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::RboComponentSizeColorCase::RboComponentSizeColorCase
            ((RboComponentSizeColorCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "renderbuffer_component_size_color","RENDERBUFFER_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::RboComponentSizeDepthCase::RboComponentSizeDepthCase
            ((RboComponentSizeDepthCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "renderbuffer_component_size_depth","RENDERBUFFER_x_SIZE");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_1::RboSamplesCase::RboSamplesCase
            ((RboSamplesCase *)pTVar1,(this->super_TestCaseGroup).m_context,"renderbuffer_samples",
             "RENDERBUFFER_SAMPLES");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void RboStateQueryTests::init (void)
{
	addChild(new RboSizeCase				(m_context, "renderbuffer_size",					"RENDERBUFFER_WIDTH and RENDERBUFFER_HEIGHT"));
	addChild(new RboInternalFormatCase		(m_context, "renderbuffer_internal_format",			"RENDERBUFFER_INTERNAL_FORMAT"));
	addChild(new RboComponentSizeColorCase	(m_context, "renderbuffer_component_size_color",	"RENDERBUFFER_x_SIZE"));
	addChild(new RboComponentSizeDepthCase	(m_context, "renderbuffer_component_size_depth",	"RENDERBUFFER_x_SIZE"));
	addChild(new RboSamplesCase				(m_context, "renderbuffer_samples",					"RENDERBUFFER_SAMPLES"));
}